

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O1

void drawMap(void)

{
  char cVar1;
  uint8_t *puVar2;
  int _x;
  long lVar3;
  int c;
  long lVar4;
  int y_00;
  int y;
  int iVar5;
  int x;
  int iVar6;
  char *pcVar7;
  
  iVar6 = 0;
  do {
    y_00 = 0;
    iVar5 = 0;
    do {
      c = 0;
      if ((uint)(map_view_x + iVar6) < 0x50) {
        c = 0;
        if ((uint)(map_view_y + iVar5) < 0x20) {
          c = map_buffer[(uint)((map_view_y + iVar5) * 0x50 + map_view_x + iVar6)];
        }
      }
      drawChar(iVar6 * 4,y_00,c);
      iVar5 = iVar5 + 1;
      y_00 = y_00 + 6;
    } while (iVar5 != 10);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x20);
  puVar2 = jedi_screen_buffer + 0x1d00;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      puVar2[lVar4] = 0xff;
      lVar4 = lVar4 + 0x80;
    } while (lVar4 != 0x300);
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 0x80);
  if (status_line[0] != '\0') {
    iVar6 = 0;
    pcVar7 = status_line;
    cVar1 = status_line[0];
    do {
      pcVar7 = pcVar7 + 1;
      drawChar(iVar6,0x3a,(int)cVar1 | 0x100);
      cVar1 = *pcVar7;
      iVar6 = iVar6 + 4;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

static void drawMap()
{
    for(int x=0; x<DISPLAY_WIDTH / 4; x++)
    {
        for(int y=0; y<DISPLAY_HEIGHT / 6; y++)
        {
            int n = 0;
            if ((x + map_view_x) >= 0 && (x + map_view_x) < NUMCOLS && (y + map_view_y) >= 0 && (y + map_view_y) < NUMLINES)
                n = map_buffer[(x + map_view_x) + (y + map_view_y) * NUMCOLS];

            drawChar(x*4, y*6, n);
        }
    }
    fillBox(0, DISPLAY_HEIGHT-6, DISPLAY_WIDTH, 6, 255);
    for(char* c=status_line; *c; c++)
    {
        drawChar((c-status_line)*4, DISPLAY_HEIGHT-6, (*c) | DISPLAY_INVERT);
    }
}